

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::
emplaceRealloc<slang::ast::RandSeqProductionSymbol::ProdItem_const&>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> *this,pointer pos,
          ProdItem *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  undefined8 uVar3;
  RandSeqProductionSymbol *pRVar4;
  size_t sVar5;
  ProdBase PVar6;
  undefined4 uVar7;
  ProdItem *__cur_1;
  pointer pPVar8;
  pointer pPVar9;
  pointer pPVar10;
  pointer pPVar11;
  EVP_PKEY_CTX *pEVar12;
  EVP_PKEY_CTX *ctx;
  long lVar13;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar12 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar12 < ctx) {
    pEVar12 = ctx;
  }
  if (0x3ffffffffffffff - uVar2 < uVar2) {
    pEVar12 = (EVP_PKEY_CTX *)0x3ffffffffffffff;
  }
  lVar13 = (long)pos - (long)this->data_;
  pPVar8 = (pointer)operator_new((long)pEVar12 << 5);
  uVar3 = *(undefined8 *)args;
  pRVar4 = args->target;
  sVar5 = (args->args)._M_extent._M_extent_value;
  puVar1 = (undefined8 *)((long)pPVar8 + lVar13 + 0x10);
  *puVar1 = (args->args)._M_ptr;
  puVar1[1] = sVar5;
  *(undefined8 *)((long)pPVar8 + lVar13) = uVar3;
  ((undefined8 *)((long)pPVar8 + lVar13))[1] = pRVar4;
  pPVar11 = this->data_;
  pPVar9 = pPVar11 + this->len;
  pPVar10 = pPVar8;
  if (pPVar9 == pos) {
    for (; pPVar11 != pos; pPVar11 = pPVar11 + 1) {
      PVar6.kind = (pPVar11->super_ProdBase).kind;
      uVar7 = *(undefined4 *)&pPVar11->field_0x4;
      pRVar4 = pPVar11->target;
      sVar5 = (pPVar11->args)._M_extent._M_extent_value;
      (pPVar10->args)._M_ptr = (pPVar11->args)._M_ptr;
      (pPVar10->args)._M_extent._M_extent_value = sVar5;
      pPVar10->super_ProdBase = (ProdBase)PVar6.kind;
      *(undefined4 *)&pPVar10->field_0x4 = uVar7;
      pPVar10->target = pRVar4;
      pPVar10 = pPVar10 + 1;
    }
  }
  else {
    for (; pPVar11 != pos; pPVar11 = pPVar11 + 1) {
      PVar6.kind = (pPVar11->super_ProdBase).kind;
      uVar7 = *(undefined4 *)&pPVar11->field_0x4;
      pRVar4 = pPVar11->target;
      sVar5 = (pPVar11->args)._M_extent._M_extent_value;
      (pPVar10->args)._M_ptr = (pPVar11->args)._M_ptr;
      (pPVar10->args)._M_extent._M_extent_value = sVar5;
      pPVar10->super_ProdBase = (ProdBase)PVar6.kind;
      *(undefined4 *)&pPVar10->field_0x4 = uVar7;
      pPVar10->target = pRVar4;
      pPVar10 = pPVar10 + 1;
    }
    puVar1 = (undefined8 *)(lVar13 + (long)pPVar8);
    for (; pos != pPVar9; pos = pos + 1) {
      uVar3 = *(undefined8 *)pos;
      pRVar4 = pos->target;
      sVar5 = (pos->args)._M_extent._M_extent_value;
      puVar1[6] = (pos->args)._M_ptr;
      puVar1[7] = sVar5;
      puVar1[4] = uVar3;
      puVar1[5] = pRVar4;
      puVar1 = puVar1 + 4;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar12;
  this->data_ = pPVar8;
  return (pointer)((long)pPVar8 + lVar13);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}